

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<TPZGeoElSideIndex>::Resize(TPZVec<TPZGeoElSideIndex> *this,int64_t newsize)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  int64_t *piVar5;
  long lVar6;
  TPZGeoElSideIndex *pTVar7;
  long lVar8;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar8 = this->fNElements;
  if (lVar8 == newsize) {
    return;
  }
  if (newsize == 0) {
    this->fNElements = 0;
    this->fNAlloc = 0;
    pTVar7 = this->fStore;
    if (pTVar7 != (TPZGeoElSideIndex *)0x0) {
      operator_delete__(&pTVar7[-1].fSide,*(long *)&pTVar7[-1].fSide * 0x18 + 8);
    }
    this->fStore = (TPZGeoElSideIndex *)0x0;
    return;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = newsize;
  uVar3 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar4 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
    uVar3 = uVar4;
  }
  piVar5 = (int64_t *)operator_new__(uVar3);
  *piVar5 = newsize;
  pTVar7 = (TPZGeoElSideIndex *)(piVar5 + 1);
  do {
    (pTVar7->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSideIndex_0187bb90;
    pTVar7->fSide = -1;
    pTVar7->fGeoElIndex = -1;
    pTVar7 = pTVar7 + 1;
  } while (pTVar7 != (TPZGeoElSideIndex *)(piVar5 + newsize * 3 + 1));
  if (newsize <= lVar8) {
    lVar8 = newsize;
  }
  pTVar7 = this->fStore;
  if (lVar8 < 1) {
    if (pTVar7 == (TPZGeoElSideIndex *)0x0) goto LAB_00e42dbb;
  }
  else {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)piVar5 + lVar6 + 0x10) =
           *(undefined8 *)((long)&pTVar7->fGeoElIndex + lVar6);
      *(undefined4 *)((long)piVar5 + lVar6 + 0x18) = *(undefined4 *)((long)&pTVar7->fSide + lVar6);
      lVar6 = lVar6 + 0x18;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  operator_delete__(&pTVar7[-1].fSide,*(long *)&pTVar7[-1].fSide * 0x18 + 8);
LAB_00e42dbb:
  this->fStore = (TPZGeoElSideIndex *)(piVar5 + 1);
  this->fNElements = newsize;
  this->fNAlloc = newsize;
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}